

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_target(TARGET_HANDLE target)

{
  AMQP_VALUE pAVar1;
  
  if (target != (TARGET_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(target->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_target(TARGET_HANDLE target)
{
    AMQP_VALUE result;

    if (target == NULL)
    {
        result = NULL;
    }
    else
    {
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        result = amqpvalue_clone(target_instance->composite_value);
    }

    return result;
}